

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinject.h
# Opt level: O2

void __thiscall
cinject::ComponentBuilderBase<IWalker,IRunner,IJumper,ICrawler,ISwimmer,IWaterConsumer,Human>::
registerType<Human,cinject::InstanceStorage<Human,cinject::ConstructorFactory<Human,void>>,IJumper,ICrawler,ISwimmer,IWaterConsumer,Human>
          (ComponentBuilderBase<IWalker,IRunner,IJumper,ICrawler,ISwimmer,IWaterConsumer,Human>
           *this,shared_ptr<cinject::InstanceStorage<Human,_cinject::ConstructorFactory<Human,_void>_>_>
                 *instanceStorage)

{
  __shared_ptr<cinject::InstanceStorage<Human,_cinject::ConstructorFactory<Human,_void>_>,_(__gnu_cxx::_Lock_policy)2>
  local_40;
  __shared_ptr<cinject::InstanceStorage<Human,_cinject::ConstructorFactory<Human,_void>_>,_(__gnu_cxx::_Lock_policy)2>
  local_30;
  
  std::
  __shared_ptr<cinject::InstanceStorage<Human,_cinject::ConstructorFactory<Human,_void>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_30,
                 &instanceStorage->
                  super___shared_ptr<cinject::InstanceStorage<Human,_cinject::ConstructorFactory<Human,_void>_>,_(__gnu_cxx::_Lock_policy)2>
                );
  addRegistration<Human,cinject::InstanceStorage<Human,cinject::ConstructorFactory<Human,void>>,IJumper>
            (this,(shared_ptr<cinject::InstanceStorage<Human,_cinject::ConstructorFactory<Human,_void>_>_>
                   *)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  std::
  __shared_ptr<cinject::InstanceStorage<Human,_cinject::ConstructorFactory<Human,_void>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_40,
                 &instanceStorage->
                  super___shared_ptr<cinject::InstanceStorage<Human,_cinject::ConstructorFactory<Human,_void>_>,_(__gnu_cxx::_Lock_policy)2>
                );
  registerType<Human,cinject::InstanceStorage<Human,cinject::ConstructorFactory<Human,void>>,ICrawler,ISwimmer,IWaterConsumer,Human>
            (this,(shared_ptr<cinject::InstanceStorage<Human,_cinject::ConstructorFactory<Human,_void>_>_>
                   *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  return;
}

Assistant:

void registerType(std::shared_ptr<TInstanceStorage> instanceStorage)
    {
        // register
        addRegistration<TImplementation, TInstanceStorage, TComponent1>(instanceStorage);


        registerType<TImplementation, TInstanceStorage, TComponentOther, TRest...>(instanceStorage);
    }